

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void gai_ComputePatchIndexWithSkip
               (Integer ndim,Integer *lo,Integer *plo,Integer *skip,Integer *ld,Integer *idx_buf)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (*plo - *lo) / *skip;
  lVar2 = 1;
  if (1 < ndim) {
    lVar2 = ndim;
  }
  for (lVar3 = 0; *idx_buf = lVar1, lVar2 + -1 != lVar3; lVar3 = lVar3 + 1) {
    lVar1 = lVar1 + ((plo[lVar3 + 1] - lo[lVar3 + 1]) / skip[lVar3 + 1]) * ld[lVar3];
  }
  return;
}

Assistant:

void gai_ComputePatchIndexWithSkip(Integer ndim, Integer *lo, Integer *plo,
                                   Integer *skip, Integer *ld, Integer *idx_buf)
{
  Integer i, delta, inc, factor;
  delta = plo[0] - lo[0];
  inc = delta%skip[0];
  delta -= inc;
  delta /=  skip[0];
  *idx_buf = delta;
  for (i=0; i<ndim-1; i++) {
    factor = ld[i];
    delta = plo[i+1]-lo[i+1];
    inc = delta%skip[i+1];
    delta -= inc;
    delta /=  skip[i+1];
    *idx_buf += factor*delta;
  }
}